

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall
CGameClient::CClientData::UpdateBotRenderInfo
          (CClientData *this,CGameClient *pGameClient,int ClientID)

{
  float fVar1;
  byte bVar2;
  CNetObj_PlayerInfo *pCVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  pCVar3 = (pGameClient->m_Snap).m_paPlayerInfos[ClientID];
  if ((pCVar3 == (CNetObj_PlayerInfo *)0x0) || ((pCVar3->m_PlayerFlags & 0x40) == 0)) {
    (this->m_RenderInfo).m_BotTexture.m_Id = -1;
    (this->m_RenderInfo).m_BotColor.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0
    ;
    (this->m_RenderInfo).m_BotColor.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0
    ;
    (this->m_RenderInfo).m_BotColor.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0
    ;
    (this->m_RenderInfo).m_BotColor.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x0
    ;
  }
  else {
    (this->m_RenderInfo).m_BotTexture.m_Id = (pGameClient->m_pSkins->m_BotTexture).m_Id;
    fVar1 = (this->m_RenderInfo).m_BotColor.field_3.w;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      iVar4 = rand();
      lVar5 = (long)iVar4 + ((ulong)(long)iVar4 / 3 & 0xfffffffffffffffc) * -3;
      bVar2 = UpdateBotRenderInfo::s_aBotColors[lVar5][2];
      auVar6._0_4_ = (float)(*(ushort *)UpdateBotRenderInfo::s_aBotColors[lVar5] & 0xff);
      auVar6._4_4_ = (float)(byte)(*(ushort *)UpdateBotRenderInfo::s_aBotColors[lVar5] >> 8);
      auVar6._8_8_ = 0;
      auVar6 = divps(auVar6,_DAT_001da050);
      (this->m_RenderInfo).m_BotColor.field_0 =
           (anon_union_4_2_94730227_for_vector4_base<float>_1)(int)auVar6._0_8_;
      (this->m_RenderInfo).m_BotColor.field_1 =
           (anon_union_4_2_947300d3_for_vector4_base<float>_3)(int)((ulong)auVar6._0_8_ >> 0x20);
      (this->m_RenderInfo).m_BotColor.field_2.z = (float)bVar2 / 255.0;
      (this->m_RenderInfo).m_BotColor.field_3.w = 1.0;
    }
  }
  return;
}

Assistant:

void CGameClient::CClientData::UpdateBotRenderInfo(CGameClient *pGameClient, int ClientID)
{
	static const unsigned char s_aBotColors[][3] = {
		{0xff,0x00,0x00},
		{0xff,0x66,0x00},
		{0x4d,0x9f,0x45},
		{0xd5,0x9e,0x29},
		{0x9f,0xd3,0xa9},
		{0xbd,0xd8,0x5e},
		{0xc0,0x7f,0x94},
		{0xc3,0xa2,0x67},
		{0xf8,0xa8,0x3b},
		{0xcc,0xe2,0xbf},
		{0xe6,0xb4,0x98},
		{0x74,0xc7,0xa3},
	};

	if(pGameClient->m_Snap.m_paPlayerInfos[ClientID] && pGameClient->m_Snap.m_paPlayerInfos[ClientID]->m_PlayerFlags&PLAYERFLAG_BOT)
	{
		m_RenderInfo.m_BotTexture = pGameClient->m_pSkins->m_BotTexture;
		if(!m_RenderInfo.m_BotColor.a) // bot color has not been set; pick a random color once
		{
			const unsigned char* pBotColor = s_aBotColors[rand()%(sizeof(s_aBotColors)/sizeof(s_aBotColors[0]))];
			m_RenderInfo.m_BotColor = vec4(pBotColor[0]/255.f, pBotColor[1]/255.f, pBotColor[2]/255.f, 1.0f);
		}
	}
	else
	{
		m_RenderInfo.m_BotTexture.Invalidate();
		m_RenderInfo.m_BotColor = vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}